

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::char_event(Application *this,uint codepoint)

{
  PathTracer *this_00;
  time_t __val;
  bool useCatmullClark;
  Scene *this_01;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch_modes(this,codepoint);
  switch(*(undefined4 *)&(this->super_Renderer).field_0xc) {
  case 0:
    switch(codepoint) {
    case 0x43:
    case 99:
      DynamicScene::Scene::collapse_selected_element(this->scene);
      break;
    case 0x44:
    case 100:
      DynamicScene::Scene::downsample_selected_mesh(this->scene);
      break;
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x56:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x76:
      break;
    case 0x46:
    case 0x66:
      DynamicScene::Scene::flip_selected_edge(this->scene);
      break;
    case 0x49:
    case 0x69:
      DynamicScene::Scene::resample_selected_mesh(this->scene);
      break;
    case 0x4c:
    case 0x6c:
      queueLoad(this);
      goto LAB_0019d0ac;
    case 0x4e:
    case 0x6e:
      DynamicScene::Scene::selectNextHalfedge(this->scene);
      break;
    case 0x53:
      this_01 = this->scene;
      useCatmullClark = false;
      goto LAB_0019d1cb;
    case 0x54:
      DynamicScene::Scene::triangulateSelection(this->scene);
      break;
    case 0x55:
    case 0x75:
      DynamicScene::Scene::upsample_selected_mesh(this->scene);
      break;
    case 0x57:
    case 0x77:
      queueWrite(this);
      goto LAB_0019d0ac;
    case 0x62:
      this->action = (uint)(this->action != Bevel) * 2;
      break;
    case 0x65:
      cycle_edit_action(this);
      break;
    case 0x68:
      DynamicScene::Scene::selectHalfedge(this->scene);
      break;
    case 0x70:
      DynamicScene::Scene::split_selected_edge(this->scene);
      break;
    case 0x73:
      this_01 = this->scene;
      useCatmullClark = true;
LAB_0019d1cb:
      DynamicScene::Scene::subdivideSelection(this_01,useCatmullClark);
      break;
    case 0x74:
      DynamicScene::Scene::selectTwinHalfedge(this->scene);
      break;
    default:
      if (codepoint == 0x20) {
        this->action = Navigate;
      }
    }
    break;
  case 1:
    switch(codepoint) {
    case 0x57:
switchD_0019cfa6_caseD_57:
      this_00 = this->pathtracer;
      std::__cxx11::string::string((string *)&local_78,"ScreenShot_",&local_b9);
      __val = ::time((time_t *)0x0);
      std::__cxx11::to_string(&local_98,__val);
      std::operator+(&local_58,&local_78,&local_98);
      std::__cxx11::string::string((string *)&local_b8,".png",&local_ba);
      std::operator+(&local_38,&local_58,&local_b8);
      PathTracer::save_image(this_00,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      break;
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5c:
    case 0x5e:
      break;
    case 0x5b:
    case 0x5d:
switchD_0019cfa6_caseD_5b:
      PathTracer::key_press(this->pathtracer,codepoint);
      break;
    case 0x5f:
switchD_0019cfa6_caseD_5f:
      PathTracer::stop(this->pathtracer);
      PathTracer::decrease_area_light_sample_count(this->pathtracer);
      goto LAB_0019d098;
    default:
      if (codepoint != 0x2b) {
        if (codepoint == 0x2d) goto switchD_0019cfa6_caseD_5f;
        if (codepoint != 0x3d) {
          if (codepoint == 0x77) goto switchD_0019cfa6_caseD_57;
          break;
        }
      }
      PathTracer::stop(this->pathtracer);
      PathTracer::increase_area_light_sample_count(this->pathtracer);
LAB_0019d098:
      PathTracer::start_raytracing(this->pathtracer);
    }
    break;
  case 2:
    switch(codepoint) {
    case 0x50:
switchD_0019cf89_caseD_50:
      to_pose_action(this);
      break;
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
      break;
    case 0x53:
      this->symmetryEnabled = (bool)(this->symmetryEnabled ^ 1);
      break;
    case 0x58:
      this->symmetryAxis = X;
      break;
    case 0x59:
      this->symmetryAxis = Y;
      break;
    case 0x5a:
      this->symmetryAxis = Z;
      break;
    default:
      if (codepoint == 0x43) {
LAB_0019cf24:
        this->clickedJoint = (Joint *)0x0;
        toggle_create_joint_action(this);
      }
      else {
        if (codepoint == 0x70) goto switchD_0019cf89_caseD_50;
        if (codepoint == 0x65) {
          if (this->action == Object) {
            DynamicScene::XFormWidget::cycleMode(this->scene->elementTransform);
          }
        }
        else if (codepoint == 0x67) {
          toggleGhosted(this);
        }
        else if (codepoint == 99) goto LAB_0019cf24;
      }
    }
    break;
  case 3:
    if (codepoint != 0x20) goto switchD_0019cfa6_caseD_5b;
    reset_camera(this);
  }
  executeFileOp(this,codepoint);
LAB_0019d0ac:
  updateWidgets(this);
  return;
}

Assistant:

void Application::char_event(unsigned int codepoint) {
  bool queued = false;

  switch_modes(codepoint);

  switch (mode) {
    case RENDER_MODE:
      switch (codepoint) {
        case 'w':
        case 'W':
          pathtracer->save_image(string("ScreenShot_") +
                                 string(to_string(time(NULL))) +
                                 string(".png"));
          break;
        case '+':
        case '=':
          pathtracer->stop();
          pathtracer->increase_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '-':
        case '_':
          pathtracer->stop();
          pathtracer->decrease_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '[':
        case ']':
          pathtracer->key_press(codepoint);
          break;
      }
      break;
    case VISUALIZE_MODE:
      switch (codepoint) {
        case ' ':
          reset_camera();
          break;
        default:
          pathtracer->key_press(codepoint);
      }
      break;
    case ANIMATE_MODE:
      switch (codepoint) {
        case 'c':
        case 'C':
          // 'c'reate joints
          clickedJoint = nullptr;
          toggle_create_joint_action();
          break;
        case 'e':
          if (action == Action::Object) scene->elementTransform->cycleMode();
          break;
        case 'g':
          toggleGhosted();
          break;
        case 'p':
        case 'P':
          to_pose_action();
          break;
        case 'S':
          symmetryEnabled = !symmetryEnabled;
          break;
        case 'X':
          symmetryAxis = Axis::X;
          break;
        case 'Y':
          symmetryAxis = Axis::Y;
          break;
        case 'Z':
          symmetryAxis = Axis::Z;
          break;
      }
      break;
    case MODEL_MODE:
      switch (codepoint) {
        case 'u':
        case 'U':
          scene->upsample_selected_mesh();
          break;
        case 'd':
        case 'D':
          scene->downsample_selected_mesh();
          break;
        case 'i':
        case 'I':
          // i for isotropic.
          scene->resample_selected_mesh();
          break;
        case 'f':
        case 'F':
          scene->flip_selected_edge();
          break;
        case 'p':
          scene->split_selected_edge();
          break;
        case 'c':
        case 'C':
          scene->collapse_selected_element();
          break;
        case 'n':
        case 'N':
          scene->selectNextHalfedge();
          break;
        case 't':
          scene->selectTwinHalfedge();
          break;
        case 'T':
          scene->triangulateSelection();
          break;
        case 's':
          // Catmull-Clark subdivision
          scene->subdivideSelection(true);
          break;
        case 'S':
          // linear subdivision
          scene->subdivideSelection(false);
          break;
        case 'h':
          scene->selectHalfedge();
          break;
        case ' ':
          to_navigate_action();
          break;
        case 'b':
          toggle_bevel_action();
          break;
        case 'e':
          cycle_edit_action();
          break;
        case 'w':
        case 'W':
          queueWrite();
          queued = true;
          break;
        case 'l':
        case 'L':
          queueLoad();
          queued = true;
          break;
        default:
          break;
      }
      break;
  }

  if (!queued) {
    executeFileOp(codepoint);
  }
  updateWidgets();
}